

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

void Error(char *err,char *obj,bool usage)

{
  long lVar1;
  
  printf("%s: %s\n",program_name,err);
  if (obj != (char *)0x0) {
    printf(": %s",obj);
  }
  putchar(10);
  if (usage) {
    printf("usage: %s [OPTION]... FILE...\n",program_name);
    lVar1 = 0;
    do {
      printf("  -%s      %s.\n",*(undefined8 *)((long)&generators[0].extension + lVar1),
             *(undefined8 *)((long)&generators[0].help + lVar1));
      lVar1 = lVar1 + 0x20;
    } while (lVar1 != 0x80);
    printf("  -o PATH Prefix PATH to all generated files.\nFILEs may depend on declarations in earlier files.\nOutput files are named using the base file name of the input,and written to the current directory or the path given by -o.\nexample: %s -c -b schema1.fbs schema2.fbs data.json\n"
           ,program_name);
  }
  exit(1);
}

Assistant:

void Error(const char *err, const char *obj, bool usage) {
  printf("%s: %s\n", program_name, err);
  if (obj) printf(": %s", obj);
  printf("\n");
  if (usage) {
    printf("usage: %s [OPTION]... FILE...\n", program_name);
    for (size_t i = 0; i < sizeof(generators) / sizeof(generators[0]); ++i)
      printf("  -%s      %s.\n", generators[i].extension, generators[i].help);
    printf("  -o PATH Prefix PATH to all generated files.\n"
           "FILEs may depend on declarations in earlier files.\n"
           "Output files are named using the base file name of the input,"
           "and written to the current directory or the path given by -o.\n"
           "example: %s -c -b schema1.fbs schema2.fbs data.json\n",
           program_name);
  }
  exit(1);
}